

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O2

string * __thiscall
pbrt::MLTSampler::ToString_abi_cxx11_(string *__return_storage_ptr__,MLTSampler *this)

{
  int *in_RAX;
  
  StringPrintf<pbrt::RNG_const&,float_const&,float_const&,int_const&,pstd::vector<pbrt::MLTSampler::PrimarySample,pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>>const&,long_const&,bool_const&,long_const&,int_const&,int_const&>
            (__return_storage_ptr__,
             (pbrt *)
             "[ MLTSampler rng: %s sigma: %f largeStepProbability: %f streamCount: %d X: %s currentIteration: %d largeStep: %s lastLargeStepIteration: %d streamIndex: %d sampleIndex: %d ] "
             ,(char *)&this->rng,(RNG *)&this->sigma,&this->largeStepProbability,
             (float *)&this->streamCount,(int *)&this->X,
             (vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
              *)&this->currentIteration,(long *)&this->largeStep,
             (bool *)&this->lastLargeStepIteration,(long *)&this->streamIndex,&this->sampleIndex,
             in_RAX);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const {
        return StringPrintf(
            "[ MLTSampler rng: %s sigma: %f largeStepProbability: %f "
            "streamCount: %d X: %s currentIteration: %d largeStep: %s "
            "lastLargeStepIteration: %d streamIndex: %d sampleIndex: %d ] ",
            rng, sigma, largeStepProbability, streamCount, X, currentIteration, largeStep,
            lastLargeStepIteration, streamIndex, sampleIndex);
    }